

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  EdgeControlSpecifierSyntax *args_3;
  TimingCheckEventConditionSyntax *args_1;
  TimingCheckEventArgSyntax *pTVar1;
  Token TVar2;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  EdgeControlSpecifierSyntax *in_stack_ffffffffffffffb0;
  EdgeControlSpecifierSyntax *args;
  BumpAllocator *this;
  
  TVar2 = parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  this = TVar2._0_8_;
  if (*(long *)(__fn + 0x28) == 0) {
    args_3 = (EdgeControlSpecifierSyntax *)0x0;
  }
  else {
    args_3 = deepClone<slang::syntax::EdgeControlSpecifierSyntax>
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  args = args_3;
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xa5fdbc);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (*(long *)(__fn + 0x38) == 0) {
    args_1 = (TimingCheckEventConditionSyntax *)0x0;
  }
  else {
    args_1 = deepClone<slang::syntax::TimingCheckEventConditionSyntax>
                       ((TimingCheckEventConditionSyntax *)in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
  }
  pTVar1 = BumpAllocator::
           emplace<slang::syntax::TimingCheckEventArgSyntax,slang::parsing::Token,slang::syntax::EdgeControlSpecifierSyntax*,slang::syntax::ExpressionSyntax&,slang::syntax::TimingCheckEventConditionSyntax*>
                     (this,(Token *)args,(EdgeControlSpecifierSyntax **)args_1,
                      (ExpressionSyntax *)__child_stack,(TimingCheckEventConditionSyntax **)args_3);
  return (int)pTVar1;
}

Assistant:

static SyntaxNode* clone(const TimingCheckEventArgSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<TimingCheckEventArgSyntax>(
        node.edge.deepClone(alloc),
        node.controlSpecifier ? deepClone(*node.controlSpecifier, alloc) : nullptr,
        *deepClone<ExpressionSyntax>(*node.terminal, alloc),
        node.condition ? deepClone(*node.condition, alloc) : nullptr
    );
}